

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O0

size_t add_pair(pExecutor exec)

{
  int iVar1;
  size_t sStack_20;
  int res;
  size_t place;
  pExecutor exec_local;
  
  place = (size_t)exec;
  iVar1 = find_place_for_pair(exec,&stack0xffffffffffffffe0);
  if (iVar1 == 2) {
    gc_collect((pExecutor)place);
    iVar1 = find_place_for_pair((pExecutor)place,&stack0xffffffffffffffe0);
    if (iVar1 == 2) {
      printf("add_pair: out of memory\n");
      return 0x7fffffff;
    }
  }
  *(undefined4 *)(*(long *)(place + 0x48) + sStack_20 * 4) = 1;
  return sStack_20;
}

Assistant:

size_t add_pair(pExecutor exec)
{
    size_t place;
    int res = find_place_for_pair(exec, &place);
    if (res == FIND_PLACE_ERROR)
    {
        // free unused memory and try again
        gc_collect(exec);
        res = find_place_for_pair(exec, &place);
        if (res == FIND_PLACE_ERROR)
        {
            log("add_pair: out of memory");
            return EXPR_ERROR;
        }
    }
    exec->pairsFlags[place] = GC_USED;
    return place;
}